

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O2

void mcmgarb(mcmcx1def *ctx)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  mcmodef *pmVar4;
  uint uVar5;
  ushort *__dest;
  byte bVar6;
  ulong uVar7;
  ushort *p;
  ushort *puVar8;
  mcmhdef **ppmVar9;
  mcmon objnum;
  mcmodef **ppmVar10;
  
  ppmVar9 = &ctx->mcmcxhpch;
LAB_002164c3:
  do {
    ppmVar9 = &(*ppmVar9)->mcmhnxt;
    if (ppmVar9 == (mcmhdef **)0x0) {
      return;
    }
    __dest = (ushort *)mcmffh(ctx,(uchar *)(ppmVar9 + 1));
  } while (__dest == (ushort *)0x0);
  do {
    ppmVar10 = ctx->mcmcxtab;
    puVar8 = (ushort *)((long)__dest + (ulong)ppmVar10[*__dest >> 8][(byte)*__dest].mcmosiz + 8);
LAB_00216506:
    uVar1 = *__dest;
    uVar7 = (ulong)uVar1;
    p = __dest;
    do {
      p = (ushort *)
          ((long)p +
          (ulong)*(ushort *)
                  ((long)&ppmVar10[uVar7 >> 8]->mcmosiz + (ulong)(((uint)uVar7 & 0xff) << 5)) + 8);
      uVar2 = *p;
      uVar7 = (ulong)uVar2;
      if (uVar7 == 0xffff) goto LAB_002164c3;
      if ((ppmVar10[uVar2 >> 8][(byte)uVar2].mcmoflg & 4) != 0) goto LAB_0021655d;
    } while (-1 < (char)ppmVar10[uVar2 >> 8][(byte)uVar2].mcmoflg);
    if (p == puVar8) {
      uVar5 = uVar1 & 0xff;
    }
    else {
      uVar5 = uVar1 & 0xff;
      uVar2 = *(ushort *)((long)&ppmVar10[uVar1 >> 8]->mcmosiz + (ulong)(uVar5 << 5));
      uVar7 = (ulong)(uVar2 + 8 & 0xffff);
      puVar8 = (ushort *)((long)p - uVar7);
      *(ushort **)((long)&ppmVar10[uVar1 >> 8]->mcmoptr + (ulong)(uVar5 << 5)) = puVar8 + 4;
      memmove(__dest,(void *)(uVar7 + (long)__dest),(long)p - ((ulong)uVar2 + (long)__dest));
      for (; __dest != puVar8;
          __dest = (ushort *)
                   ((long)__dest +
                   (ulong)*(ushort *)
                           ((long)&ctx->mcmcxtab[*__dest >> 8]->mcmosiz +
                           (ulong)((*__dest & 0xff) << 5)) + 8)) {
        *(ushort **)((long)&ctx->mcmcxtab[*__dest >> 8]->mcmoptr + (ulong)((*__dest & 0xff) << 5)) =
             __dest + 4;
      }
      *puVar8 = uVar1;
      ppmVar10 = ctx->mcmcxtab;
      __dest = puVar8;
    }
    uVar2 = *(ushort *)((long)&ppmVar10[uVar1 >> 8]->mcmosiz + (ulong)(uVar5 << 5));
    uVar7 = (ulong)uVar2;
    uVar3 = *(ushort *)((long)__dest + uVar7 + 8);
    bVar6 = (byte)uVar3;
    pmVar4 = ppmVar10[uVar3 >> 8];
    *(ushort *)((long)&ppmVar10[uVar1 >> 8]->mcmosiz + (ulong)(uVar5 << 5)) =
         pmVar4[bVar6].mcmosiz + uVar2 + 8;
    mcmunl(ctx,*(mcmon *)((long)__dest + uVar7 + 8),&ctx->mcmcxfre);
    pmVar4[bVar6].mcmonxt = ctx->mcmcxunu;
    ctx->mcmcxunu = *(mcmon *)((long)__dest + uVar7 + 8);
    pmVar4[bVar6].mcmoflg = 0;
  } while( true );
LAB_0021655d:
  __dest = (ushort *)mcmffh(ctx,(uchar *)p);
  if (__dest == (ushort *)0x0) goto LAB_002164c3;
  goto LAB_00216506;
}

Assistant:

static void mcmgarb(mcmcx1def *ctx)
{
    mcmhdef *h;
    uchar   *p;
    uchar   *q;
    uchar   *nxt;
    ushort   flags;
    
    MCMGLBCTX(ctx);

    for (h = ctx->mcmcxhpch ; h ; h = h->mcmhnxt)
    {
        p = (uchar *)(h+1);                   /* get pointer to actual heap */
        p = mcmffh(ctx, p);                 /* get first free block in heap */
        if (!p) continue;             /* can't do anything - no free blocks */
        nxt = mcmnxh(ctx, p);              /* remember immediate next block */
        
        for (q=p ;; )
        {
            q = mcmnxh(ctx, q);                  /* find next chunk in heap */
            if (*(mcmon *)q == MCMONINV) break;      /* reached end of heap */
            assert(mcmgobje(ctx, *(mcmon *)q)->mcmoptr
                   == q + osrndsz(sizeof(mcmon)));
            flags = mcmgobje(ctx, *(mcmon *)q)->mcmoflg;       /* get flags */

            /* if the block is locked, p can't be relocated */
            if (flags & MCMOFLOCK)
            {
                p = mcmffh(ctx, q);         /* find next free block after p */
                q = p;
                if (p) continue;   /* try again; start with next free block */
                else break;         /* no more free blocks - done with heap */
            }

            /* if the block is free, we can relocate between p and q */
            if (flags & MCMOFFREE)
            {
                if (q != nxt) p = mcmreloc(ctx, p, q);          /* relocate */
                mcmconsol(ctx, p);           /* consolidate two free blocks */
                
                /* resume looking, starting with consolidated block */
                nxt = mcmnxh(ctx, p);
                q = p;
                continue;
            }
        }
    }
}